

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool __thiscall leveldb::Compaction::IsTrivialMove(Compaction *this)

{
  VersionSet *pVVar1;
  int iVar2;
  int64_t iVar3;
  int64_t iVar4;
  bool local_19;
  VersionSet *vset;
  Compaction *this_local;
  
  pVVar1 = this->input_version_->vset_;
  iVar2 = num_input_files(this,0);
  local_19 = false;
  if (iVar2 == 1) {
    iVar2 = num_input_files(this,1);
    local_19 = false;
    if (iVar2 == 0) {
      iVar3 = TotalFileSize(&this->grandparents_);
      iVar4 = MaxGrandParentOverlapBytes(pVVar1->options_);
      local_19 = iVar3 <= iVar4;
    }
  }
  return local_19;
}

Assistant:

bool Compaction::IsTrivialMove() const {
  const VersionSet* vset = input_version_->vset_;
  // Avoid a move if there is lots of overlapping grandparent data.
  // Otherwise, the move could create a parent file that will require
  // a very expensive merge later on.
  return (num_input_files(0) == 1 && num_input_files(1) == 0 &&
          TotalFileSize(grandparents_) <=
              MaxGrandParentOverlapBytes(vset->options_));
}